

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

int __thiscall
CTcTokenizer::expand_macros_curline
          (CTcTokenizer *this,int read_more,int allow_defined,int append_to_expbuf)

{
  int iVar1;
  CTcTokenizer *this_00;
  
  this_00 = this;
  iVar1 = expand_macros(this,&this->linebuf_,&this->p_,&this->expbuf_,read_more,allow_defined,
                        append_to_expbuf);
  if ((iVar1 == 0) &&
     ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x4) !=
      (undefined1  [3440])0x0)) {
    remove_expansion_flags(this_00,&this->expbuf_);
  }
  return iVar1;
}

Assistant:

int CTcTokenizer::expand_macros_curline(int read_more, int allow_defined,
                                        int append_to_expbuf)
{
    int err;
    
    /* expand macros in the current line */
    err = expand_macros(&linebuf_, &p_, &expbuf_, read_more, allow_defined,
                        append_to_expbuf);

    /* if that failed, return an error */
    if (err != 0)
        return err;

    /* 
     *   if we're in preprocessor mode, clean up the text for human
     *   consumption by removing our various expansion flags
     */
    if (pp_only_mode_)
        remove_expansion_flags(&expbuf_);

    /* return the result */
    return err;
}